

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::force(Solver *this,ImpliedLiteral *p)

{
  Literal LVar1;
  uint uVar2;
  bool bVar3;
  uint32 uVar4;
  ImpliedLiteral *pIVar5;
  
  LVar1.rep_ = (p->lit).rep_;
  uVar2 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(LVar1.rep_ & 0xfffffffc));
  if ((byte)((byte)uVar2 & 3) == (byte)(2U - ((LVar1.rep_ & 2) == 0))) {
    if (uVar2 >> 4 <= p->level) {
      return true;
    }
    pIVar5 = ImpliedList::find(&this->impliedLits_,LVar1);
    if (pIVar5 != (ImpliedLiteral *)0x0) {
      if (pIVar5->level <= p->level) {
        return true;
      }
      uVar4 = p->level;
      pIVar5->lit = (Literal)(p->lit).rep_;
      pIVar5->level = uVar4;
      (pIVar5->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ =
           (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_;
      uVar4 = (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second;
      (pIVar5->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second = uVar4;
      setReason(this,(Literal)(p->lit).rep_,(Antecedent *)&p->ante,uVar4);
      return true;
    }
  }
  uVar4 = undoUntil(this,p->level);
  if (uVar4 != p->level) {
    ImpliedList::add(&this->impliedLits_,(this->levels_).super_type.ebo_.size,p);
  }
  LVar1.rep_ = (p->lit).rep_;
  if (((byte)(*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(LVar1.rep_ & 0xfffffffc)) &
             3) == (byte)(2U - ((LVar1.rep_ & 2) == 0))) &&
     (bVar3 = setReason(this,LVar1,(Antecedent *)&p->ante,
                        (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second), bVar3)) {
    return true;
  }
  bVar3 = force(this,&p->lit,(Antecedent *)&p->ante,
                (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second);
  return bVar3;
}

Assistant:

bool Solver::force(const ImpliedLiteral& p) {
	// Already implied?
	if (isTrue(p.lit)) {
		if (level(p.lit.var()) <= p.level) { return true; }
		if (ImpliedLiteral* x = impliedLits_.find(p.lit)) {
			if (x->level > p.level) {
				*x = p;
				setReason(p.lit, p.ante.ante(), p.ante.data());
			}
			return true;
		}
	}
	if (undoUntil(p.level) != p.level) {
		// Logically the implication is on level p.level.
		// Store enough information so that p can be re-assigned once we backtrack.
		impliedLits_.add(decisionLevel(), p);
	}
	return (isTrue(p.lit) && setReason(p.lit, p.ante.ante(), p.ante.data())) || force(p.lit, p.ante.ante(), p.ante.data());
}